

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,nk_bool *selected,char *hash,int len,int line)

{
  nk_window *win_00;
  int iVar1;
  nk_uint *pnVar2;
  char *in_RCX;
  long in_RDI;
  nk_uint in_R8D;
  void *in_stack_00000008;
  int in_stack_00000010;
  nk_hash in_stack_00000018;
  nk_uint *state;
  nk_hash tree_hash;
  int title_len;
  nk_window *win;
  int in_stack_0000007c;
  undefined4 in_stack_0000008c;
  nk_tree_type in_stack_00000094;
  nk_context *in_stack_00000098;
  nk_bool *in_stack_000000b0;
  undefined8 in_stack_ffffffffffffff88;
  nk_window *in_stack_ffffffffffffff90;
  nk_context *in_stack_ffffffffffffff98;
  undefined4 local_40;
  
  win_00 = *(nk_window **)(in_RDI + 0x40d8);
  if (in_stack_00000008 == (void *)0x0) {
    iVar1 = nk_strlen(in_RCX);
    local_40 = nk_murmur_hash(in_RCX,iVar1,in_stack_00000018);
  }
  else {
    local_40 = nk_murmur_hash(in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  pnVar2 = nk_find_value(win_00,local_40);
  if (pnVar2 == (nk_uint *)0x0) {
    pnVar2 = nk_add_value(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          (nk_hash)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                          (nk_uint)in_stack_ffffffffffffff88);
    *pnVar2 = in_R8D;
  }
  nk_strlen(in_RCX);
  iVar1 = nk_tree_element_image_push_hashed_base
                    (in_stack_00000098,in_stack_00000094,(nk_image *)CONCAT44(in_stack_0000008c,len)
                     ,hash,in_stack_0000007c,(nk_collapse_states *)ctx,in_stack_000000b0);
  return iVar1;
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
nk_bool *selected, const char *hash, int len, int line)
{
struct nk_window *win = ctx->current;
int title_len = 0;
nk_hash tree_hash = 0;
nk_uint *state = 0;

/* retrieve tree state from internal widget state tables */
if (!hash) {
title_len = (int)nk_strlen(title);
tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
} else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
state = nk_find_value(win, tree_hash);
if (!state) {
state = nk_add_value(ctx, win, tree_hash, 0);
*state = initial_state;
} return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
nk_strlen(title), (enum nk_collapse_states*)state, selected);
}